

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exchange_dt.h
# Opt level: O3

void __thiscall AllReduce::kernel(AllReduce *this,int param_1,int param_2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 in_XMM1_Qa;
  undefined1 auVar5 [16];
  undefined8 in_XMM2_Qb;
  
  (this->sbuf).dt = (this->super_ExchangeDt).dt;
  auVar3._0_8_ = (double)(this->super_ExchangeDt).x;
  auVar3._8_8_ = in_XMM1_Qa;
  auVar5._0_8_ = (double)(this->super_ExchangeDt).y;
  auVar5._8_8_ = in_XMM1_Qa;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (this->packer).dscale;
  auVar1 = vfmadd132sd_fma(auVar5,auVar3,auVar1);
  auVar4._0_8_ = (double)(this->super_ExchangeDt).z;
  auVar4._8_8_ = in_XMM2_Qb;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (this->packer).dscale2;
  auVar1 = vfmadd132sd_fma(auVar4,auVar1,auVar2);
  (this->sbuf).index = (int)auVar1._0_8_;
  MPI_Allreduce(&this->sbuf,&this->rbuf,1,&ompi_mpi_double_int,&ompi_mpi_op_minloc,
                &ompi_mpi_comm_world);
  return;
}

Assistant:

inline void kernel(int, int) override
    {
        sbuf.dt = dt;
        // See the comments in the constructor.
        sbuf.index = (int)packer.pack(x, y, z);

        MPI_Allreduce(&sbuf, &rbuf, 1, MPI_DOUBLE_INT, MPI_MINLOC, MPI_COMM_WORLD);

        int coords[3];
        packer.unpack(rbuf.index, coords);
#ifdef DEBUG_MODE
        std::cout << "rank " << rank << " min dt " << rbuf.dt << " at "
                  << coords[0] << ", " << coords[1] << ", " << coords[2] << "\n";
#endif
    }